

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddExecutableCommand.cxx
# Opt level: O1

bool __thiscall
cmAddExecutableCommand::InitialPass
          (cmAddExecutableCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pbVar1;
  pointer pcVar2;
  cmMakefile *pcVar3;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __last;
  char *pcVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  PolicyStatus PVar10;
  undefined8 uVar11;
  long lVar12;
  ostream *poVar13;
  cmTarget *pcVar14;
  PolicyID id;
  MessageType t;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  srclists;
  string exename;
  ostringstream e;
  string local_1f8;
  uint local_1d8;
  uint local_1d4;
  uint local_1d0;
  uint local_1cc;
  string local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x21) {
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
    }
    return false;
  }
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  pcVar2 = (pbVar1->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,pcVar2,pcVar2 + pbVar1->_M_string_length);
  __first._M_current = pbVar1 + 1;
  if (__first._M_current ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    bVar8 = false;
    local_1d0 = 0;
    bVar7 = false;
    local_1d8 = 0;
    local_1d4 = 0;
    local_1cc = 0;
  }
  else {
    local_1cc = 0;
    local_1d4 = 0;
    local_1d8 = 0;
    bVar7 = false;
    local_1d0 = 0;
    bVar8 = false;
    do {
      uVar11 = std::__cxx11::string::compare((char *)__first._M_current);
      bVar6 = bVar7;
      if ((int)uVar11 == 0) {
        local_1cc = (uint)CONCAT71((int7)((ulong)uVar11 >> 8),1);
      }
      else {
        uVar11 = std::__cxx11::string::compare((char *)__first._M_current);
        if ((int)uVar11 == 0) {
          local_1d4 = (uint)CONCAT71((int7)((ulong)uVar11 >> 8),1);
        }
        else {
          uVar11 = std::__cxx11::string::compare((char *)__first._M_current);
          if ((int)uVar11 == 0) {
            local_1d8 = (uint)CONCAT71((int7)((ulong)uVar11 >> 8),1);
          }
          else {
            iVar9 = std::__cxx11::string::compare((char *)__first._M_current);
            if (iVar9 == 0) {
              bVar8 = true;
            }
            else if ((bVar8) &&
                    (uVar11 = std::__cxx11::string::compare((char *)__first._M_current),
                    (int)uVar11 == 0)) {
              local_1d0 = (uint)CONCAT71((int7)((ulong)uVar11 >> 8),1);
            }
            else {
              iVar9 = std::__cxx11::string::compare((char *)__first._M_current);
              bVar6 = true;
              if (iVar9 != 0) break;
            }
          }
        }
      }
      bVar7 = bVar6;
      __first._M_current = __first._M_current + 1;
    } while (__first._M_current !=
             (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  }
  bVar6 = cmGeneratorExpression::IsValidTargetName(&local_1c8);
  if (bVar6) {
    bVar6 = cmGlobalGenerator::IsReservedTarget(&local_1c8);
    bVar6 = !bVar6;
  }
  else {
    bVar6 = false;
  }
  if (!(bool)(bVar8 | bVar7 | ~bVar6 & 1U)) {
    lVar12 = std::__cxx11::string::find((char *)&local_1c8,0x4efbd0,0);
    bVar6 = lVar12 == -1;
  }
  if (bVar6) {
LAB_00274d59:
    if (bVar8) {
      if ((local_1cc & 1) == 0) {
        if ((local_1d4 & 1) == 0) {
          if ((local_1d8 & 1) == 0) goto LAB_00274e1c;
          if ((local_1d4 & 1) == 0) {
            local_1a8._0_8_ = local_1a8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1a8,
                       "may not be given EXCLUDE_FROM_ALL for an IMPORTED target.","");
            cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
            goto LAB_00275013;
          }
        }
        local_1a8._0_8_ = local_1a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"may not be given MACOSX_BUNDLE for an IMPORTED target.","");
        cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
      }
      else {
        local_1a8._0_8_ = local_1a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"may not be given WIN32 for an IMPORTED target.","");
        cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
      }
LAB_00275013:
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
LAB_0027501d:
        operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
      }
    }
    else {
LAB_00274e1c:
      if (bVar7) {
        bVar7 = cmGeneratorExpression::IsValidTargetName(&local_1c8);
        if (bVar7) {
          if ((local_1d8 & 1) == 0) {
            if (!bVar8 && (local_1d0 & 1) == 0) {
              if ((long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start == 0x60) {
                pcVar4 = ((__first._M_current)->_M_dataplus)._M_p;
                pcVar3 = (this->super_cmCommand).Makefile;
                std::__cxx11::string::string((string *)local_1a8,pcVar4,(allocator *)&local_1f8);
                bVar8 = cmMakefile::IsAlias(pcVar3,(string *)local_1a8);
                pcVar2 = local_1a8 + 0x10;
                if ((pointer)local_1a8._0_8_ != pcVar2) {
                  operator_delete((void *)local_1a8._0_8_,
                                  CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
                }
                if (bVar8) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"cannot create ALIAS target \"",0x1c);
                  poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_1a8,local_1c8._M_dataplus._M_p,
                                       local_1c8._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar13,"\" because target \"",0x12);
                  poVar13 = std::operator<<(poVar13,pcVar4);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar13,"\" is itself an ALIAS.",0x15);
                  std::__cxx11::stringbuf::str();
                  cmCommand::SetError(&this->super_cmCommand,&local_1f8);
                }
                else {
                  pcVar3 = (this->super_cmCommand).Makefile;
                  std::__cxx11::string::string((string *)local_1a8,pcVar4,(allocator *)&local_1f8);
                  pcVar14 = cmMakefile::FindTargetToUse(pcVar3,(string *)local_1a8,true);
                  if ((pointer)local_1a8._0_8_ != pcVar2) {
                    operator_delete((void *)local_1a8._0_8_,
                                    CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
                  }
                  if (pcVar14 == (cmTarget *)0x0) {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,"cannot create ALIAS target \"",0x1c);
                    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_1a8,local_1c8._M_dataplus._M_p,
                                         local_1c8._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar13,"\" because target \"",0x12);
                    poVar13 = std::operator<<(poVar13,pcVar4);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar13,"\" does not already exist.",0x19);
                    std::__cxx11::stringbuf::str();
                    cmCommand::SetError(&this->super_cmCommand,&local_1f8);
                  }
                  else if (pcVar14->TargetTypeValue == EXECUTABLE) {
                    if (pcVar14->IsImportedTarget != true) {
                      pcVar3 = (this->super_cmCommand).Makefile;
                      std::__cxx11::string::string
                                ((string *)local_1a8,pcVar4,(allocator *)&local_1f8);
                      cmMakefile::AddAlias(pcVar3,&local_1c8,(string *)local_1a8);
                      if ((pointer)local_1a8._0_8_ != pcVar2) {
                        operator_delete((void *)local_1a8._0_8_,
                                        CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
                      }
                      goto LAB_0027516a;
                    }
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,"cannot create ALIAS target \"",0x1c);
                    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_1a8,local_1c8._M_dataplus._M_p,
                                         local_1c8._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar13,"\" because target \"",0x12);
                    poVar13 = std::operator<<(poVar13,pcVar4);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar13,"\" is IMPORTED.",0xe);
                    std::__cxx11::stringbuf::str();
                    cmCommand::SetError(&this->super_cmCommand,&local_1f8);
                  }
                  else {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,"cannot create ALIAS target \"",0x1c);
                    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_1a8,local_1c8._M_dataplus._M_p,
                                         local_1c8._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar13,"\" because target \"",0x12);
                    poVar13 = std::operator<<(poVar13,pcVar4);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar13,"\" is not an executable.",0x17);
                    std::__cxx11::stringbuf::str();
                    cmCommand::SetError(&this->super_cmCommand,&local_1f8);
                  }
                }
              }
              else {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"ALIAS requires exactly one target argument.",0x2b);
                std::__cxx11::stringbuf::str();
                cmCommand::SetError(&this->super_cmCommand,&local_1f8);
              }
              goto LAB_00274f00;
            }
            local_1a8._0_8_ = local_1a8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1a8,"IMPORTED with ALIAS is not allowed.","");
            cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
          }
          else {
            local_1a8._0_8_ = local_1a8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1a8,"EXCLUDE_FROM_ALL with ALIAS makes no sense.","");
            cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
          }
          goto LAB_00275013;
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a8,"Invalid name for ALIAS: ",&local_1c8);
        cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
        if ((undefined1 *)local_1a8._0_8_ == local_1a8 + 0x10) goto LAB_0027502a;
        goto LAB_0027501d;
      }
      if (bVar8) {
        pcVar14 = cmMakefile::FindTargetToUse((this->super_cmCommand).Makefile,&local_1c8,false);
        if (pcVar14 == (cmTarget *)0x0) {
          bVar8 = true;
          cmMakefile::AddImportedTarget
                    ((this->super_cmCommand).Makefile,&local_1c8,EXECUTABLE,
                     (bool)((byte)local_1d0 & 1));
          goto LAB_0027502c;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"cannot create imported target \"",0x1f);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,local_1c8._M_dataplus._M_p,
                             local_1c8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar13,"\" because another target with the same name already exists.",0x3b);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&local_1f8);
LAB_00274f00:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
        }
        goto LAB_00274f1b;
      }
      pcVar2 = local_1a8 + 0x10;
      local_1a8._8_8_ = 0;
      local_1a8[0x10] = '\0';
      local_1a8._0_8_ = pcVar2;
      bVar8 = cmMakefile::EnforceUniqueName
                        ((this->super_cmCommand).Makefile,&local_1c8,(string *)local_1a8,false);
      if (bVar8) {
        if ((pointer)local_1a8._0_8_ != pcVar2) {
          operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
        }
      }
      else {
        cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
        if ((pointer)local_1a8._0_8_ != pcVar2) {
          operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
        }
        if (!bVar8) goto LAB_0027502a;
      }
      __last._M_current =
           (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (__first._M_current != __last._M_current) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        vector<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1f8,
                   __first,__last,(allocator_type *)local_1a8);
        pcVar14 = cmMakefile::AddExecutable
                            ((this->super_cmCommand).Makefile,local_1c8._M_dataplus._M_p,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_1f8,(bool)((byte)local_1d8 & 1));
        if ((local_1cc & 1) != 0) {
          local_1a8._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"WIN32_EXECUTABLE","")
          ;
          cmTarget::SetProperty(pcVar14,(string *)local_1a8,"ON");
          if ((pointer)local_1a8._0_8_ != pcVar2) {
            operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
          }
        }
        if ((local_1d4 & 1) != 0) {
          local_1a8._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"MACOSX_BUNDLE","");
          cmTarget::SetProperty(pcVar14,(string *)local_1a8,"ON");
          if ((pointer)local_1a8._0_8_ != pcVar2) {
            operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_1f8);
LAB_0027516a:
        bVar8 = true;
        goto LAB_0027502c;
      }
      local_1a8._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,
                 "called with incorrect number of arguments, no sources provided","");
      cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
      if ((pointer)local_1a8._0_8_ != pcVar2) goto LAB_0027501d;
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    PVar10 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0037);
    if (PVar10 - NEW < 3) {
      t = FATAL_ERROR;
      bVar5 = true;
      bVar6 = true;
    }
    else {
      bVar5 = false;
      t = AUTHOR_WARNING;
      bVar6 = false;
      if (PVar10 == WARN) {
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1f8,(cmPolicies *)0x25,id);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,local_1f8._M_dataplus._M_p,
                             local_1f8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
        }
        bVar6 = true;
        bVar5 = false;
        t = AUTHOR_WARNING;
      }
    }
    if (!bVar6) {
LAB_00274d3b:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      goto LAB_00274d59;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"The target name \"",0x11);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,local_1c8._M_dataplus._M_p,local_1c8._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,
               "\" is reserved or not valid for certain CMake features, such as generator expressions, and may result in undefined behavior."
               ,0x7b);
    pcVar3 = (this->super_cmCommand).Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar3,t,&local_1f8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    if (!bVar5) goto LAB_00274d3b;
LAB_00274f1b:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
LAB_0027502a:
  bVar8 = false;
LAB_0027502c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  return bVar8;
}

Assistant:

bool cmAddExecutableCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 2 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }
  std::vector<std::string>::const_iterator s = args.begin();

  std::string exename = *s;

  ++s;
  bool use_win32 = false;
  bool use_macbundle = false;
  bool excludeFromAll = false;
  bool importTarget = false;
  bool importGlobal = false;
  bool isAlias = false;
  while ( s != args.end() )
    {
    if (*s == "WIN32")
      {
      ++s;
      use_win32 = true;
      }
    else if ( *s == "MACOSX_BUNDLE" )
      {
      ++s;
      use_macbundle = true;
      }
    else if(*s == "EXCLUDE_FROM_ALL")
      {
      ++s;
      excludeFromAll = true;
      }
    else if(*s == "IMPORTED")
     {
     ++s;
     importTarget = true;
     }
    else if(importTarget && *s == "GLOBAL")
      {
      ++s;
      importGlobal = true;
      }
    else if(*s == "ALIAS")
      {
      ++s;
      isAlias = true;
      }
    else
      {
      break;
      }
    }

  bool nameOk = cmGeneratorExpression::IsValidTargetName(exename) &&
    !cmGlobalGenerator::IsReservedTarget(exename);

  if (nameOk && !importTarget && !isAlias)
    {
    nameOk = exename.find(":") == std::string::npos;
    }
  if (!nameOk)
    {
    cmake::MessageType messageType = cmake::AUTHOR_WARNING;
    std::ostringstream e;
    bool issueMessage = false;
    switch(this->Makefile->GetPolicyStatus(cmPolicies::CMP0037))
      {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0037) << "\n";
        issueMessage = true;
      case cmPolicies::OLD:
        break;
      case cmPolicies::NEW:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        issueMessage = true;
        messageType = cmake::FATAL_ERROR;
      }
    if (issueMessage)
      {
      e << "The target name \"" << exename <<
          "\" is reserved or not valid for certain "
          "CMake features, such as generator expressions, and may result "
          "in undefined behavior.";
      this->Makefile->IssueMessage(messageType, e.str());

      if (messageType == cmake::FATAL_ERROR)
        {
        return false;
        }
      }
    }

  // Special modifiers are not allowed with IMPORTED signature.
  if(importTarget
      && (use_win32 || use_macbundle || excludeFromAll))
    {
    if(use_win32)
      {
      this->SetError("may not be given WIN32 for an IMPORTED target.");
      }
    else if(use_macbundle)
      {
      this->SetError(
        "may not be given MACOSX_BUNDLE for an IMPORTED target.");
      }
    else // if(excludeFromAll)
      {
      this->SetError(
        "may not be given EXCLUDE_FROM_ALL for an IMPORTED target.");
      }
    return false;
    }
  if (isAlias)
    {
    if(!cmGeneratorExpression::IsValidTargetName(exename))
      {
      this->SetError("Invalid name for ALIAS: " + exename);
      return false;
      }
    if(excludeFromAll)
      {
      this->SetError("EXCLUDE_FROM_ALL with ALIAS makes no sense.");
      return false;
      }
    if(importTarget || importGlobal)
      {
      this->SetError("IMPORTED with ALIAS is not allowed.");
      return false;
      }
    if(args.size() != 3)
      {
      std::ostringstream e;
      e << "ALIAS requires exactly one target argument.";
      this->SetError(e.str());
      return false;
      }

    const char *aliasedName = s->c_str();
    if(this->Makefile->IsAlias(aliasedName))
      {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << exename
        << "\" because target \"" << aliasedName << "\" is itself an ALIAS.";
      this->SetError(e.str());
      return false;
      }
    cmTarget *aliasedTarget =
                    this->Makefile->FindTargetToUse(aliasedName, true);
    if(!aliasedTarget)
      {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << exename
        << "\" because target \"" << aliasedName << "\" does not already "
        "exist.";
      this->SetError(e.str());
      return false;
      }
    cmState::TargetType type = aliasedTarget->GetType();
    if(type != cmState::EXECUTABLE)
      {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << exename
        << "\" because target \"" << aliasedName << "\" is not an "
        "executable.";
      this->SetError(e.str());
      return false;
      }
    if(aliasedTarget->IsImported())
      {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << exename
        << "\" because target \"" << aliasedName << "\" is IMPORTED.";
      this->SetError(e.str());
      return false;
      }
    this->Makefile->AddAlias(exename, aliasedName);
    return true;
    }

  // Handle imported target creation.
  if(importTarget)
    {
    // Make sure the target does not already exist.
    if(this->Makefile->FindTargetToUse(exename))
      {
      std::ostringstream e;
      e << "cannot create imported target \"" << exename
        << "\" because another target with the same name already exists.";
      this->SetError(e.str());
      return false;
      }

    // Create the imported target.
    this->Makefile->AddImportedTarget(exename, cmState::EXECUTABLE,
                                      importGlobal);
    return true;
    }

  // Enforce name uniqueness.
  {
  std::string msg;
  if(!this->Makefile->EnforceUniqueName(exename, msg))
    {
    this->SetError(msg);
    return false;
    }
  }

  if (s == args.end())
    {
    this->SetError
      ("called with incorrect number of arguments, no sources provided");
    return false;
    }

  std::vector<std::string> srclists(s, args.end());
  cmTarget* tgt = this->Makefile->AddExecutable(exename.c_str(), srclists,
                                                excludeFromAll);
  if ( use_win32 )
    {
    tgt->SetProperty("WIN32_EXECUTABLE", "ON");
    }
  if ( use_macbundle)
    {
    tgt->SetProperty("MACOSX_BUNDLE", "ON");
    }

  return true;
}